

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

Satellite * __thiscall SatPos::GetPosAndVel(SatPos *this,NavSys flag)

{
  NavSys flag_local;
  SatPos *this_local;
  
  this_local = this;
  if (flag != GPS) {
    if (flag != BDS) {
      exit(2);
    }
    this_local = (SatPos *)this->Bds;
  }
  return this_local->Gps;
}

Assistant:

Satellite* SatPos::GetPosAndVel(NavSys flag)
{
    if(flag == GPS)
        return Gps;
    else if(flag == BDS)
        return Bds;
    else
        exit(2);
}